

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gitlike.cxx
# Opt level: O0

void Init(string *progname,const_iterator beginargs,const_iterator endargs)

{
  __node_base_ptr *defaultValue_;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  void *pvVar4;
  EitherFlag *local_1098;
  EitherFlag *local_1070;
  EitherFlag *local_1048;
  EitherFlag *local_1018;
  Help anon_var_0;
  ParseError e;
  allocator local_fa9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa8;
  allocator local_f81;
  string local_f80;
  allocator local_f59;
  string local_f58;
  undefined1 local_f38 [8];
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  directory;
  EitherFlag local_e48;
  EitherFlag local_e20;
  iterator local_df8;
  undefined1 local_df0 [127];
  allocator local_d71;
  string local_d70;
  allocator local_d49;
  string local_d48;
  undefined1 local_d28 [8];
  Flag quiet;
  EitherFlag local_c10;
  iterator local_be8;
  undefined1 local_be0 [127];
  allocator local_b61;
  string local_b60;
  allocator local_b39;
  string local_b38;
  undefined1 local_b18 [8];
  Flag bare;
  EitherFlag local_9e0;
  iterator local_9b8;
  undefined1 local_9b0 [127];
  allocator local_931;
  string local_930;
  allocator local_909;
  string local_908;
  undefined1 local_8e8 [8];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  templatedir;
  EitherFlag local_788;
  EitherFlag local_760;
  iterator local_738;
  undefined1 local_730 [127];
  allocator local_6b1;
  string local_6b0;
  allocator local_689;
  string local_688;
  undefined1 local_668 [8];
  HelpFlag help;
  string local_538;
  allocator local_501;
  string local_500;
  undefined1 local_4e0 [8];
  ArgumentParser parser;
  string *progname_local;
  const_iterator endargs_local;
  const_iterator beginargs_local;
  
  parser.helpParams.defaultString.field_2._8_8_ = progname;
  poVar2 = std::operator<<((ostream *)&std::cout,"In Init");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_500,"",&local_501);
  std::__cxx11::string::string((string *)&local_538);
  args::ArgumentParser::ArgumentParser((ArgumentParser *)local_4e0,&local_500,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &help.super_Flag.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 parser.helpParams.defaultString.field_2._8_8_," init");
  args::ArgumentParser::Prog
            ((ArgumentParser *)local_4e0,
             (string *)&help.super_Flag.super_FlagBase.matcher.longFlags._M_h._M_single_bucket);
  std::__cxx11::string::~string
            ((string *)&help.super_Flag.super_FlagBase.matcher.longFlags._M_h._M_single_bucket);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_688,"help",&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b0,"Display this help menu",&local_6b1);
  templatedir._336_8_ = &local_788;
  args::EitherFlag::EitherFlag((EitherFlag *)templatedir._336_8_,'h');
  templatedir._336_8_ = &local_760;
  args::EitherFlag::EitherFlag((EitherFlag *)templatedir._336_8_,"help");
  local_738 = &local_788;
  local_730._0_8_ = 2;
  in_02._M_len = 2;
  in_02._M_array = local_738;
  args::Matcher::Matcher((Matcher *)(local_730 + 8),in_02);
  args::HelpFlag::HelpFlag
            ((HelpFlag *)local_668,(Group *)local_4e0,&local_688,&local_6b0,
             (Matcher *)(local_730 + 8),None);
  args::Matcher::~Matcher((Matcher *)(local_730 + 8));
  local_1018 = (EitherFlag *)&local_738;
  do {
    local_1018 = local_1018 + -1;
    args::EitherFlag::~EitherFlag(local_1018);
  } while (local_1018 != &local_788);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_908,"template-directory",&local_909);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_930,"directory from which templates will be used",&local_931);
  args::EitherFlag::EitherFlag(&local_9e0,"template");
  local_9b8 = &local_9e0;
  local_9b0._0_8_ = 1;
  in_01._M_len = 1;
  in_01._M_array = local_9b8;
  args::Matcher::Matcher((Matcher *)(local_9b0 + 8),in_01);
  defaultValue_ = &bare.super_FlagBase.matcher.longFlags._M_h._M_single_bucket;
  std::__cxx11::string::string((string *)defaultValue_);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
               *)local_8e8,(Group *)local_4e0,&local_908,&local_930,(Matcher *)(local_9b0 + 8),
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)defaultValue_,
              false);
  std::__cxx11::string::~string
            ((string *)&bare.super_FlagBase.matcher.longFlags._M_h._M_single_bucket);
  args::Matcher::~Matcher((Matcher *)(local_9b0 + 8));
  local_1048 = (EitherFlag *)&local_9b8;
  do {
    local_1048 = local_1048 + -1;
    args::EitherFlag::~EitherFlag(local_1048);
  } while (local_1048 != &local_9e0);
  std::__cxx11::string::~string((string *)&local_930);
  std::allocator<char>::~allocator((allocator<char> *)&local_931);
  std::__cxx11::string::~string((string *)&local_908);
  std::allocator<char>::~allocator((allocator<char> *)&local_909);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b38,"bare",&local_b39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b60,"create a bare repository",&local_b61);
  quiet.super_FlagBase.matcher.longFlags._M_h._M_single_bucket = (__node_base_ptr)&local_c10;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)quiet.super_FlagBase.matcher.longFlags._M_h._M_single_bucket,"bare");
  local_be8 = &local_c10;
  local_be0._0_8_ = 1;
  in_00._M_len = 1;
  in_00._M_array = local_be8;
  args::Matcher::Matcher((Matcher *)(local_be0 + 8),in_00);
  args::Flag::Flag((Flag *)local_b18,(Group *)local_4e0,&local_b38,&local_b60,
                   (Matcher *)(local_be0 + 8),false);
  args::Matcher::~Matcher((Matcher *)(local_be0 + 8));
  local_1070 = (EitherFlag *)&local_be8;
  do {
    local_1070 = local_1070 + -1;
    args::EitherFlag::~EitherFlag(local_1070);
  } while (local_1070 != &local_c10);
  std::__cxx11::string::~string((string *)&local_b60);
  std::allocator<char>::~allocator((allocator<char> *)&local_b61);
  std::__cxx11::string::~string((string *)&local_b38);
  std::allocator<char>::~allocator((allocator<char> *)&local_b39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d48,"quiet",&local_d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d70,"be quiet",&local_d71);
  directory._224_8_ = &local_e48;
  args::EitherFlag::EitherFlag((EitherFlag *)directory._224_8_,'q');
  directory._224_8_ = &local_e20;
  args::EitherFlag::EitherFlag((EitherFlag *)directory._224_8_,"quiet");
  local_df8 = &local_e48;
  local_df0._0_8_ = 2;
  in._M_len = 2;
  in._M_array = local_df8;
  args::Matcher::Matcher((Matcher *)(local_df0 + 8),in);
  args::Flag::Flag((Flag *)local_d28,(Group *)local_4e0,&local_d48,&local_d70,
                   (Matcher *)(local_df0 + 8),false);
  args::Matcher::~Matcher((Matcher *)(local_df0 + 8));
  local_1098 = (EitherFlag *)&local_df8;
  do {
    local_1098 = local_1098 + -1;
    args::EitherFlag::~EitherFlag(local_1098);
  } while (local_1098 != &local_e48);
  std::__cxx11::string::~string((string *)&local_d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_d71);
  std::__cxx11::string::~string((string *)&local_d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f58,"directory",&local_f59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f80,"The directory to create in",&local_f81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fa8,".",&local_fa9);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_f38,(Group *)local_4e0,&local_f58,&local_f80,&local_fa8,None);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
  std::__cxx11::string::~string((string *)&local_f80);
  std::allocator<char>::~allocator((allocator<char> *)&local_f81);
  std::__cxx11::string::~string((string *)&local_f58);
  std::allocator<char>::~allocator((allocator<char> *)&local_f59);
  args::ArgumentParser::
  ParseArgs<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((ArgumentParser *)local_4e0,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )beginargs._M_current,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )endargs._M_current);
  std::ostream::operator<<(&std::cout,std::boolalpha);
  poVar2 = std::operator<<((ostream *)&std::cout,"templatedir: ");
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_8e8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  poVar2 = std::operator<<(poVar2,", value: ");
  pbVar3 = args::get<args::ValueFlag<std::__cxx11::string,args::ValueReader>>
                     ((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                       *)local_8e8);
  poVar2 = std::operator<<(poVar2,(string *)pbVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"bare: ");
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_b18);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"quiet: ");
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_d28);
  pvVar4 = (void *)std::ostream::operator<<(poVar2,bVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"directory: ");
  bVar1 = args::Base::operator_cast_to_bool((Base *)local_f38);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,bVar1);
  poVar2 = std::operator<<(poVar2,", value: ");
  pbVar3 = args::get<args::Positional<std::__cxx11::string,args::ValueReader>>
                     ((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                       *)local_f38);
  poVar2 = std::operator<<(poVar2,(string *)pbVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                 *)local_f38);
  args::Flag::~Flag((Flag *)local_d28);
  args::Flag::~Flag((Flag *)local_b18);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_8e8);
  args::HelpFlag::~HelpFlag((HelpFlag *)local_668);
  args::ArgumentParser::~ArgumentParser((ArgumentParser *)local_4e0);
  return;
}

Assistant:

void Init(const std::string &progname, std::vector<std::string>::const_iterator beginargs, std::vector<std::string>::const_iterator endargs)
{
    std::cout << "In Init" << std::endl;
    args::ArgumentParser parser("");
    parser.Prog(progname + " init");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::ValueFlag<std::string> templatedir(parser, "template-directory", "directory from which templates will be used", {"template"});
    args::Flag bare(parser, "bare", "create a bare repository", {"bare"});
    args::Flag quiet(parser, "quiet", "be quiet", {'q', "quiet"});
    args::Positional<std::string> directory(parser, "directory", "The directory to create in", ".");
    try
    {
        parser.ParseArgs(beginargs, endargs);
        std::cout << std::boolalpha;
        std::cout << "templatedir: " << bool{templatedir} << ", value: " << args::get(templatedir) << std::endl;
        std::cout << "bare: " << bool{bare} << std::endl;
        std::cout << "quiet: " << bool{quiet} << std::endl;
        std::cout << "directory: " << bool{directory} << ", value: " << args::get(directory) << std::endl;
    }
    catch (args::Help)
    {
        std::cout << parser;
        return;
    }
    catch (args::ParseError e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return;
    }
}